

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

void __thiscall capnp::Type::requireUsableAs(Type *this,Type expected)

{
  Which WVar1;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 local_10;
  
  WVar1 = this->baseType;
  if ((WVar1 == expected.baseType) && (this->listDepth == expected.listDepth)) {
    if (WVar1 - 0xf < 3) {
      local_10 = this->field_4;
      Schema::requireUsableAs((Schema *)&local_10,(expected.field_4.schema)->generic);
    }
    else if (WVar1 == LIST) {
      kj::_::unreachable();
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
            ((Fault *)&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
             ,0x395,FAILED,"baseType == expected.baseType && listDepth == expected.listDepth",
             "\"This type is not compatible with the requested native type.\"",
             (char (*) [60])"This type is not compatible with the requested native type.");
  kj::_::Debug::Fault::fatal((Fault *)&local_10);
}

Assistant:

void Type::requireUsableAs(Type expected) const {
  KJ_REQUIRE(baseType == expected.baseType && listDepth == expected.listDepth,
             "This type is not compatible with the requested native type.");

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::ANY_POINTER:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      Schema(schema).requireUsableAs(expected.schema->generic);
      break;

    case schema::Type::LIST:
      KJ_UNREACHABLE;
  }
}